

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O1

void av1_set_fixed_partitioning
               (AV1_COMP *cpi,TileInfo *tile,MB_MODE_INFO **mib,int mi_row,int mi_col,
               BLOCK_SIZE bsize)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  MB_MODE_INFO *pMVar5;
  bool bVar6;
  long lVar7;
  int iVar8;
  int bh;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  undefined7 in_register_00000089;
  int iVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  
  iVar14 = tile->mi_row_end - mi_row;
  iVar18 = tile->mi_col_end - mi_col;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [(cpi->common).mi_params.mi_alloc_bsize];
  iVar8 = (cpi->common).mi_params.mi_alloc_stride;
  iVar11 = (mi_row / (int)(uint)bVar1) * iVar8 + mi_col / (int)(uint)bVar1;
  uVar16 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  uVar9 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar16]
  ;
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar16];
  iVar3 = ((cpi->common).seq_params)->mib_size;
  pMVar5 = (cpi->common).mi_params.mi_alloc;
  if (iVar14 < iVar3 || iVar18 < iVar3) {
    if (0 < ((cpi->common).seq_params)->mib_size) {
      uVar13 = 3;
      if (bsize < 3) {
        uVar13 = (uint)bsize;
      }
      iVar8 = 0;
      do {
        if (0 < ((cpi->common).seq_params)->mib_size) {
          iVar3 = (cpi->common).mi_params.mi_stride;
          bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [(cpi->common).mi_params.mi_alloc_bsize];
          iVar4 = (cpi->common).mi_params.mi_alloc_stride;
          iVar19 = iVar14 - iVar8;
          iVar15 = 0;
          uVar10 = (uint)bVar2;
          do {
            mib[iVar15 + iVar3 * iVar8] =
                 pMVar5 + (long)iVar11 +
                          (long)(iVar15 / (int)(uint)bVar1 + (iVar8 / (int)(uint)bVar1) * iVar4);
            uVar12 = (uint)bsize;
            uVar17 = uVar12;
            if (iVar18 <= iVar15 || 0 >= iVar19) {
              uVar17 = uVar13;
            }
            if ((bsize != BLOCK_4X4) && (iVar15 < iVar18 && 0 < iVar19)) {
              do {
                uVar9 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [uVar12];
                uVar10 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                               [uVar12];
                if (((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                [uVar12] <= iVar19) &&
                   (uVar17 = uVar12, (int)uVar10 <= iVar18 - iVar15)) break;
                uVar17 = uVar12 - 3;
                bVar6 = 3 < (int)uVar12;
                uVar12 = uVar17;
              } while (bVar6);
            }
            pMVar5[(long)iVar11 +
                   (long)(iVar15 / (int)(uint)bVar1 + (iVar8 / (int)(uint)bVar1) * iVar4)].bsize =
                 (BLOCK_SIZE)uVar17;
            iVar15 = iVar15 + uVar10;
          } while (iVar15 < ((cpi->common).seq_params)->mib_size);
        }
        iVar8 = iVar8 + uVar9;
      } while (iVar8 < ((cpi->common).seq_params)->mib_size);
    }
  }
  else if (0 < ((cpi->common).seq_params)->mib_size) {
    uVar13 = 0;
    do {
      if (0 < ((cpi->common).seq_params)->mib_size) {
        iVar3 = (cpi->common).mi_params.mi_stride;
        uVar16 = 0;
        do {
          lVar7 = (long)(int)((int)((uVar16 & 0xffffffff) / (ulong)bVar1) + (uVar13 / bVar1) * iVar8
                             );
          mib[(long)(int)uVar13 * (long)iVar3 + uVar16] = pMVar5 + iVar11 + lVar7;
          pMVar5[iVar11 + lVar7].bsize = bsize;
          uVar16 = uVar16 + (uint)bVar2;
        } while ((long)uVar16 < (long)((cpi->common).seq_params)->mib_size);
      }
      uVar13 = uVar13 + uVar9;
    } while ((int)uVar13 < ((cpi->common).seq_params)->mib_size);
  }
  return;
}

Assistant:

void av1_set_fixed_partitioning(AV1_COMP *cpi, const TileInfo *const tile,
                                MB_MODE_INFO **mib, int mi_row, int mi_col,
                                BLOCK_SIZE bsize) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int mi_rows_remaining = tile->mi_row_end - mi_row;
  const int mi_cols_remaining = tile->mi_col_end - mi_col;
  MB_MODE_INFO *const mi_upper_left =
      mi_params->mi_alloc + get_alloc_mi_idx(mi_params, mi_row, mi_col);
  int bh = mi_size_high[bsize];
  int bw = mi_size_wide[bsize];

  assert(bsize >= mi_params->mi_alloc_bsize &&
         "Attempted to use bsize < mi_params->mi_alloc_bsize");
  assert((mi_rows_remaining > 0) && (mi_cols_remaining > 0));

  // Apply the requested partition size to the SB if it is all "in image"
  if ((mi_cols_remaining >= cm->seq_params->mib_size) &&
      (mi_rows_remaining >= cm->seq_params->mib_size)) {
    for (int block_row = 0; block_row < cm->seq_params->mib_size;
         block_row += bh) {
      for (int block_col = 0; block_col < cm->seq_params->mib_size;
           block_col += bw) {
        const int grid_index = get_mi_grid_idx(mi_params, block_row, block_col);
        const int mi_index = get_alloc_mi_idx(mi_params, block_row, block_col);
        mib[grid_index] = mi_upper_left + mi_index;
        mib[grid_index]->bsize = bsize;
      }
    }
  } else {
    // Else this is a partial SB.
    set_partial_sb_partition(cm, mi_upper_left, bh, bw, mi_rows_remaining,
                             mi_cols_remaining, bsize, mib);
  }
}